

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O3

spv_result_t spvtools::val::MergeBlockAssert(ValidationState_t *_,uint32_t merge_block)

{
  bool bVar1;
  Function *pFVar2;
  Instruction *inst;
  spv_result_t sVar3;
  string local_220;
  DiagnosticStream local_200;
  
  pFVar2 = ValidationState_t::current_function(_);
  bVar1 = Function::IsBlockType(pFVar2,merge_block,kBlockTypeMerge);
  sVar3 = SPV_SUCCESS;
  if (bVar1) {
    pFVar2 = ValidationState_t::current_function(_);
    inst = ValidationState_t::FindDef(_,pFVar2->id_);
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_CFG,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,"Block ",6);
    ValidationState_t::getIdName_abi_cxx11_(&local_220,_,merge_block);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200,local_220._M_dataplus._M_p,local_220._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_200," is already a merge block for another header",0x2c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_200);
    sVar3 = local_200.error_;
  }
  return sVar3;
}

Assistant:

spv_result_t MergeBlockAssert(ValidationState_t& _, uint32_t merge_block) {
  if (_.current_function().IsBlockType(merge_block, kBlockTypeMerge)) {
    return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(_.current_function().id()))
           << "Block " << _.getIdName(merge_block)
           << " is already a merge block for another header";
  }
  return SPV_SUCCESS;
}